

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O0

void __thiscall DIS::MinefieldStatePdu::~MinefieldStatePdu(MinefieldStatePdu *this)

{
  MinefieldStatePdu *this_local;
  
  ~MinefieldStatePdu(this);
  operator_delete(this);
  return;
}

Assistant:

MinefieldStatePdu::~MinefieldStatePdu()
{
    _perimeterPoints.clear();
    _mineType.clear();
}